

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

void __thiscall EOPlus::Parser::ParseGlobal(Parser *this)

{
  int iVar1;
  int iVar2;
  Parser_Token_Server_Base *pPVar3;
  bool bVar4;
  Parser_Error *pPVar5;
  Token *t_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>_>,_bool>
  pVar6;
  allocator<char> local_281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240;
  Token t;
  undefined1 local_1d0 [64];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
  state;
  Token local_80;
  
  util::variant::variant((variant *)local_1d0);
  Token::Token(&t,Invalid,(variant *)local_1d0);
  std::__cxx11::string::~string((string *)(local_1d0 + 0x10));
  while( true ) {
    bVar4 = GetToken(this,&t,0x101);
    if (!bVar4) break;
    if (t.type == Identifier) {
      util::variant::GetString_abi_cxx11_(&state.first,&t.data);
      bVar4 = std::operator==(&state.first,"main");
      std::__cxx11::string::~string((string *)&state);
      if (bVar4) {
        if (this->quest->has_info == true) {
          pPVar5 = (Parser_Error *)__cxa_allocate_exception(0x18);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&state,"Quest can only contain one main-block.",
                     (allocator<char> *)&local_280);
          pPVar3 = (this->tok)._M_t.
                   super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
          iVar1 = pPVar3->line;
          iVar2 = pPVar3->reject_line;
          if (iVar2 < iVar1) {
            iVar2 = iVar1;
          }
          Parser_Error::Parser_Error(pPVar5,&state.first,iVar2);
          __cxa_throw(pPVar5,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
        }
        ParseMainBlock((Info *)&state,this);
        Info::operator=(&this->quest->info,(Info *)&state);
        std::__cxx11::string::~string((string *)&state);
        this->quest->has_info = true;
      }
      else {
        util::variant::GetString_abi_cxx11_(&state.first,&t.data);
        bVar4 = std::operator==(&state.first,"state");
        std::__cxx11::string::~string((string *)&state);
        if (!bVar4) break;
        ParseStateBlock_abi_cxx11_(&state,this);
        pVar6 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,EOPlus::State>,std::_Select1st<std::pair<std::__cxx11::string_const,EOPlus::State>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,EOPlus::State>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,EOPlus::State>&>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,EOPlus::State>,std::_Select1st<std::pair<std::__cxx11::string_const,EOPlus::State>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,EOPlus::State>>>
                            *)&this->quest->states,&state);
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pPVar5 = (Parser_Error *)__cxa_allocate_exception(0x18);
          std::operator+(&local_260,"State \'",&state.first);
          std::operator+(&local_280,&local_260,"\' already exists");
          pPVar3 = (this->tok)._M_t.
                   super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
          iVar1 = pPVar3->line;
          iVar2 = pPVar3->reject_line;
          if (iVar2 < iVar1) {
            iVar2 = iVar1;
          }
          Parser_Error::Parser_Error(pPVar5,&local_280,iVar2);
          __cxa_throw(pPVar5,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
        ::~pair(&state);
      }
    }
    else if (t.type == EndOfFile) {
      if (this->quest->has_info != false) {
        std::__cxx11::string::~string((string *)&t.data.val_string);
        return;
      }
      pPVar5 = (Parser_Error *)__cxa_allocate_exception(0x18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&state,"No main-block in quest file.",(allocator<char> *)&local_280);
      pPVar3 = (this->tok)._M_t.
               super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               ._M_t.
               super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
      iVar1 = pPVar3->line;
      iVar2 = pPVar3->reject_line;
      if (iVar2 < iVar1) {
        iVar2 = iVar1;
      }
      Parser_Error::Parser_Error(pPVar5,&state.first,iVar2);
      __cxa_throw(pPVar5,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pPVar5 = (Parser_Error *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"Expected block-identifier (main/state) in global scope.",
             &local_281);
  std::operator+(&local_280,&local_260," Got: ");
  Token::Token(&local_80,
               &((this->tok)._M_t.
                 super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl)->
                reject_token);
  token_got_string_abi_cxx11_(&local_240,(EOPlus *)&local_80,t_00);
  std::operator+(&state.first,&local_280,&local_240);
  pPVar3 = (this->tok)._M_t.
           super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ._M_t.
           super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
  iVar1 = pPVar3->line;
  iVar2 = pPVar3->reject_line;
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  Parser_Error::Parser_Error(pPVar5,&state.first,iVar2);
  __cxa_throw(pPVar5,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Parser::ParseGlobal()
	{
		Token t;

		while (this->GetToken(t, Token::Identifier | Token::EndOfFile))
		{
			if (t.type == Token::Identifier)
			{
				if (std::string(t.data) == "main")
				{
					if (quest.has_info)
						PARSER_ERROR("Quest can only contain one main-block.");

					quest.info = this->ParseMainBlock();
					quest.has_info = true;
				}
				else if (std::string(t.data) == "state")
				{
					auto state = this->ParseStateBlock();

					if (!this->quest.states.insert(state).second)
						PARSER_ERROR("State '" + state.first + "' already exists");
				}
				else
				{
					break;
				}
			}
			else if (t.type == Token::EndOfFile)
			{
				if (!quest.has_info)
					PARSER_ERROR("No main-block in quest file.");

				return;
			}
		}

		PARSER_ERROR_GOT("Expected block-identifier (main/state) in global scope.");
	}